

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O2

ostream * operator<<(ostream *os,v_array<substring> *ss)

{
  substring *ss_00;
  
  ss_00 = ss->_begin;
  if (ss_00 != ss->_end) {
    while( true ) {
      operator<<(os,ss_00);
      ss_00 = ss_00 + 1;
      if (ss_00 == ss->_end) break;
      std::operator<<(os,",");
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const v_array<substring>& ss)
{
  substring* it = ss.cbegin();

  if (it == ss.cend())
  {
    return os;
  }

  os << *it;

  for (it++; it != ss.cend(); it++)
  {
    os << ",";
    os << *it;
  }

  return os;
}